

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatienceSort.h
# Opt level: O2

void __thiscall
PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>::
GenerateRuns(PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
             *this,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
            __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
            vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_> *runs)

{
  int *piVar1;
  pointer ppRVar2;
  pointer piVar3;
  double dVar4;
  RunBlock<int> **ppRVar5;
  RunPool<int> *pRVar6;
  RunBlock<int> *pRVar7;
  vector<int,_std::allocator<int>_> *pvVar8;
  RunBlock<int> *pRVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  int *value_00;
  float fVar14;
  ValueType value;
  RunPool<int> *run;
  int local_44;
  vector<int,_std::allocator<int>_> *local_40;
  RunPool<int> *local_38;
  
  ppRVar2 = (runs->super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((runs->super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppRVar2) {
    (runs->super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = ppRVar2;
  }
  lVar11 = (long)end._M_current - (long)begin._M_current >> 2;
  dVar4 = (double)lVar11;
  this->num_elements_ = lVar11;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  this->num_runs_ = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
  iVar10 = GetOrderLevel(this,begin,end);
  this->values_not_in_order_ = iVar10;
  fVar14 = (float)iVar10 / (float)this->num_elements_;
  this->sortedness_ = fVar14;
  if (0.35 < fVar14) {
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (begin._M_current,end._M_current);
    return;
  }
  fVar14 = (float)this->num_runs_ * 1.5;
  uVar12 = (ulong)fVar14;
  run_blocks_ = (long)(fVar14 - 9.223372e+18) & (long)uVar12 >> 0x3f | uVar12;
  Init();
  RunPool<int>::mem_blocks_ = GetMemPoolSize(this,this->num_elements_,this->num_runs_);
  RunPool<int>::Init();
  std::vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>::reserve(runs,this->num_runs_);
  std::vector<int,_std::allocator<int>_>::reserve(&this->lasts_,this->num_elements_);
  local_40 = &this->heads_;
  std::vector<int,_std::allocator<int>_>::reserve(local_40,this->num_elements_);
  do {
    if (begin._M_current == end._M_current) {
      return;
    }
    local_44 = *begin._M_current;
    _Var13 = std::
             __lower_bound<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int,__gnu_cxx::__ops::_Iter_comp_val<PatienceSorting<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>::GenerateRuns(__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::vector<RunPool<int>*,std::allocator<RunPool<int>*>>&)::_lambda(int&,int)_1_>>
                       ((this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,&local_44);
    if (_Var13._M_current ==
        (this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      _Var13 = std::
               __lower_bound<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int,__gnu_cxx::__ops::_Iter_less_val>
                         ((this->heads_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (this->heads_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish,&local_44);
      pvVar8 = local_40;
      pRVar7 = RunPool<int>::next_free_;
      pRVar6 = next_free_;
      if (_Var13._M_current ==
          (this->heads_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_38 = next_free_;
        ppRVar5 = &next_free_->begin_back_;
        next_free_ = next_free_ + 1;
        pRVar9 = RunPool<int>::next_free_ + 1;
        *ppRVar5 = RunPool<int>::next_free_;
        RunPool<int>::next_free_ = pRVar9;
        pRVar6->end_back_ = pRVar7;
        pRVar6->size_ = 0;
        pRVar6->begin_front_ = (RunBlock<int> *)0x0;
        pRVar6->end_front_ = (RunBlock<int> *)0x0;
        pRVar6->end_block_ = pRVar7;
        std::vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>::push_back(runs,&local_38);
        RunPool<int>::Add((runs->super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish[-1],&local_44);
        std::vector<int,_std::allocator<int>_>::push_back(&this->lasts_,&local_44);
        std::vector<int,_std::allocator<int>_>::push_back(local_40,&local_44);
      }
      else {
        lVar11 = (long)_Var13._M_current -
                 (long)(local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
        RunPool<int>::AddFront
                  (*(RunPool<int> **)
                    ((long)(runs->
                           super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>).
                           _M_impl.super__Vector_impl_data._M_start + lVar11 * 2),&local_44);
        *(int *)((long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar11) = local_44;
      }
    }
    else {
      piVar3 = (this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      RunPool<int>::Add(*(RunPool<int> **)
                         ((long)(runs->
                                super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>)
                                ._M_impl.super__Vector_impl_data._M_start +
                         ((long)_Var13._M_current - (long)piVar3) * 2),&local_44);
      lVar11 = (long)_Var13._M_current - (long)piVar3;
      *(int *)((long)(this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar11) = local_44;
      if (lVar11 == 0) {
        piVar1 = begin._M_current + 1;
        value_00 = piVar1;
        while (piVar1 != end._M_current) {
          if (*piVar1 <=
              *(this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start) {
            begin._M_current = value_00 + -1;
            break;
          }
          RunPool<int>::Add(*(runs->
                             super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>).
                             _M_impl.super__Vector_impl_data._M_start,value_00);
          *(this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = *value_00;
          value_00 = value_00 + 1;
        }
      }
    }
    begin._M_current = begin._M_current + 1;
  } while( true );
}

Assistant:

void GenerateRuns(RAI begin, RAI end, std::vector<RunPool<ValueType>*>& runs) {
        runs.clear();
        num_elements_ = std::distance(begin, end);
        num_runs_ = static_cast<size_t>(sqrt(num_elements_));

        // calculate the degree of disorder
        values_not_in_order_ = GetOrderLevel(begin, end);
        sortedness_ = values_not_in_order_ / static_cast<float>(num_elements_);

        // fallback to std::sort if input data is too random
        if(sortedness_ > kMaxSortedness) {
            std::sort(begin, end);
            return;
        }

        // Pool for runs
        SetMemSize(num_runs_ * kRunPoolSize);
        Init();

        // Pool for runblocks
        RunPool<ValueType>::SetMemSize(GetMemPoolSize(num_elements_, num_runs_));
        RunPool<ValueType>::Init();


        runs.reserve(num_runs_);
        lasts_.reserve(num_elements_);
        heads_.reserve(num_elements_);

        for (auto it = begin; it != end; ++it) {

            // binary search the right run to insert the current element
            ValueType value = *it;
            auto key = std::lower_bound(lasts_.begin(), lasts_.end(), value, [](ValueType& v1, ValueType v2) { return v1 > v2;});

            if (key != lasts_.end()) {      // if suitable run is found, append
                size_t i = std::distance(lasts_.begin(), key);
                runs[i]->Add(value);
                lasts_[i] = value;

                // if we add to the first run, try to add as many elements as possible to avoid expensive binary search
                if (i == 0) {
                    auto next_value = std::next(it, 1);
                    while (next_value != end
                           && *next_value > lasts_[i]) {
                        it++;
                        runs[0]->Add(*it);
                        lasts_[0] = *it;
                    }
                }
            }
            else {      // no suitable run found, so we try to add the element to the begin of a run

                // binary search the beginnings to find a suitable run
                key = std::lower_bound(heads_.begin(), heads_.end(), value);
                if (key == heads_.end()) {      // no suitable run found, create a new run and add it to sorted runs vector

                    RunPool<ValueType>* run = Alloc();
                    new(run) RunPool<ValueType>();      // necessary, otherwise the objects are not initialized -> memory error
                    runs.push_back(run);

                    runs.back()->Add(value);
                    lasts_.push_back(value);
                    heads_.push_back(value);
                } else {
                    // suitable run found, so append to its beginning.
                    size_t i = std::distance(heads_.begin(), key);
                    runs[i]->AddFront(value);
                    heads_[i] = value;
                }
            }
        }
    }